

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<ReadThreadsGraph,_DistanceGraph> * __thiscall
pybind11::class_<ReadThreadsGraph,DistanceGraph>::
def<std::unordered_set<std::pair<long,int>,std::hash<std::pair<long,int>>,std::equal_to<std::pair<long,int>>,std::allocator<std::pair<long,int>>>(ReadThreadsGraph::*)(long)const,pybind11::arg>
          (class_<ReadThreadsGraph,DistanceGraph> *this,char *name_,
          offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr *f,arg *extra)

{
  offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr f_00;
  name *extra_00;
  cpp_function cf;
  handle local_60;
  cpp_function local_58;
  object local_50;
  sibling local_48;
  is_method local_40;
  PyObject *local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_48.value.m_ptr = *(handle *)this;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40.class_.m_ptr = (handle)(handle)name_;
  local_60.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_60.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_38 = local_60.m_ptr;
  cpp_function::
  cpp_function<std::unordered_set<std::pair<long,int>,std::hash<std::pair<long,int>>,std::equal_to<std::pair<long,int>>,std::allocator<std::pair<long,int>>>,ReadThreadsGraph,long,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg>
            (&local_58,f_00,extra_00,&local_40,&local_48,(arg *)&local_38);
  object::~object((object *)&local_60);
  object::~object(&local_50);
  detail::add_class_method((object *)this,name_,&local_58);
  object::~object((object *)&local_58);
  return (class_<ReadThreadsGraph,_DistanceGraph> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }